

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.cpp
# Opt level: O2

void __thiscall Js::CompoundString::BlockInfo::CopyFrom(BlockInfo *this,Block *block)

{
  Type TVar1;
  
  Memory::WriteBarrierPtr<void>::WriteBarrierSet(&this->buffer,(block->bufferOwner).ptr + 1);
  TVar1 = block->charCapacity;
  this->charLength = block->charLength;
  this->charCapacity = TVar1;
  return;
}

Assistant:

void CompoundString::BlockInfo::CopyFrom(Block *const block)
    {
        buffer = block->Buffer();
        charLength = block->CharLength();
        charCapacity = block->CharCapacity();
    }